

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cVertexAttribBindingTests.cpp
# Opt level: O2

long __thiscall glcts::anon_unknown_0::AdvancedIterations::Cleanup(AdvancedIterations *this)

{
  CallLogWrapper *this_00;
  
  this_00 = &(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glDisable(this_00,0x8c89);
  glu::CallLogWrapper::glUseProgram(this_00,0);
  glu::CallLogWrapper::glDeleteProgram(this_00,this->m_po);
  glu::CallLogWrapper::glDeleteVertexArrays(this_00,2,this->m_vao);
  glu::CallLogWrapper::glDeleteTransformFeedbacks(this_00,2,this->m_xfo);
  glu::CallLogWrapper::glDeleteBuffers(this_00,2,this->m_buffer);
  return 0;
}

Assistant:

virtual long Cleanup()
	{
		glDisable(GL_RASTERIZER_DISCARD);
		glUseProgram(0);
		glDeleteProgram(m_po);
		glDeleteVertexArrays(2, m_vao);
		glDeleteTransformFeedbacks(2, m_xfo);
		glDeleteBuffers(2, m_buffer);
		return NO_ERROR;
	}